

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_dec.c
# Opt level: O3

jas_image_t * pnm_decode(jas_stream_t *in,char *optstr)

{
  byte *pbVar1;
  jas_image_cmpt_t **ppjVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int allow_trunc;
  uint uVar6;
  int iVar7;
  jas_tvparser_t *tvp;
  jas_taginfo_t *pjVar8;
  jas_image_t *image;
  jas_clrspc_t jVar9;
  char *pcVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  _Bool _Var15;
  uint uVar16;
  ulonglong uVar17;
  int_fast32_t width;
  jas_image_cmptparm_t cmptparms [3];
  pnm_hdr_t local_100;
  ulong local_e8;
  ulong local_e0;
  jas_image_cmptparm_t local_d8 [3];
  
  iVar4 = jas_getdbglevel();
  if (9 < iVar4) {
    pcVar10 = optstr;
    if (optstr == (char *)0x0) {
      pcVar10 = "";
    }
    jas_eprintf("pnm_decode(%p, \"%s\")\n",in,pcVar10);
  }
  pcVar10 = "";
  if (optstr != (char *)0x0) {
    pcVar10 = optstr;
  }
  tvp = jas_tvparser_create(pcVar10);
  allow_trunc = 0;
  if (tvp == (jas_tvparser_t *)0x0) {
    return (jas_image_t *)0x0;
  }
  iVar5 = jas_tvparser_next(tvp);
  uVar17 = 0x4000000;
  if (iVar5 == 0) {
    allow_trunc = 0;
    do {
      pcVar10 = jas_tvparser_gettag(tvp);
      pjVar8 = jas_taginfos_lookup(pnm_decopts,pcVar10);
      pjVar8 = jas_taginfo_nonull(pjVar8);
      if (pjVar8->id == 1) {
        pcVar10 = jas_tvparser_getval(tvp);
        uVar17 = strtoull(pcVar10,(char **)0x0,10);
      }
      else if (pjVar8->id == 0) {
        pcVar10 = jas_tvparser_getval(tvp);
        allow_trunc = atoi(pcVar10);
      }
      else {
        jas_eprintf("warning: ignoring invalid option %s\n",pcVar10);
      }
      iVar5 = jas_tvparser_next(tvp);
    } while (iVar5 == 0);
  }
  jas_tvparser_destroy(tvp);
  uVar16 = in->flags_;
  if ((uVar16 & 7) != 0) {
    return (jas_image_t *)0x0;
  }
  if ((-1 < in->rwlimit_) && (in->rwlimit_ <= in->rwcnt_)) {
LAB_00135854:
    in->flags_ = uVar16 | 4;
    return (jas_image_t *)0x0;
  }
  iVar5 = in->cnt_;
  in->cnt_ = iVar5 + -1;
  if (iVar5 < 1) {
    uVar6 = jas_stream_fillbuf(in,1);
    if (uVar6 == 0xffffffff) {
      return (jas_image_t *)0x0;
    }
    uVar16 = in->flags_;
  }
  else {
    in->rwcnt_ = in->rwcnt_ + 1;
    pbVar1 = in->ptr_;
    in->ptr_ = pbVar1 + 1;
    uVar6 = (uint)*pbVar1;
  }
  if ((uVar16 & 7) != 0) {
    return (jas_image_t *)0x0;
  }
  if ((-1 < in->rwlimit_) && (in->rwlimit_ <= in->rwcnt_)) goto LAB_00135854;
  iVar5 = in->cnt_;
  in->cnt_ = iVar5 + -1;
  if (iVar5 < 1) {
    uVar16 = jas_stream_fillbuf(in,1);
    if (uVar16 == 0xffffffff) {
      return (jas_image_t *)0x0;
    }
  }
  else {
    in->rwcnt_ = in->rwcnt_ + 1;
    pbVar1 = in->ptr_;
    in->ptr_ = pbVar1 + 1;
    uVar16 = (uint)*pbVar1;
  }
  uVar16 = uVar16 & 0xff | (uVar6 & 0xff) << 8;
  local_100.magic = uVar16;
  iVar5 = pnm_getsintstr(in,(int_fast32_t *)&local_e0);
  if (iVar5 != 0) {
    return (jas_image_t *)0x0;
  }
  iVar5 = pnm_getsintstr(in,(int_fast32_t *)&local_e8);
  if (iVar5 != 0) {
    return (jas_image_t *)0x0;
  }
  iVar11 = (int)local_e0;
  iVar12 = (int)local_e8;
  local_100.width = iVar11;
  local_100.height = iVar12;
  iVar5 = pnm_type((ulong)uVar16);
  if (iVar5 == 0) {
    return (jas_image_t *)0x0;
  }
  if (iVar5 == 1) {
    local_d8[0].tlx = 1;
  }
  else {
    iVar7 = pnm_getsintstr(in,&local_d8[0].tlx);
    if (iVar7 != 0) {
      return (jas_image_t *)0x0;
    }
    if (local_d8[0].tlx < 0) {
      uVar13 = (ulong)(uint)-(int)local_d8[0].tlx;
      _Var15 = true;
      goto LAB_001358ef;
    }
  }
  _Var15 = false;
  uVar13 = local_d8[0].tlx;
LAB_001358ef:
  iVar7 = (int)uVar13;
  local_100.maxval = iVar7;
  local_100.sgnd = _Var15;
  if (iVar5 - 1U < 2) {
    lVar14 = 1;
    bVar3 = false;
  }
  else {
    if (iVar5 != 3) {
      abort();
    }
    bVar3 = true;
    lVar14 = 3;
  }
  uVar6 = (uint)lVar14;
  local_100.numcmpts = uVar6;
  if (9 < iVar4) {
    jas_eprintf("magic %lx; width %lu; height %ld; numcmpts %d; maxval %ld; sgnd %d\n",(ulong)uVar16
                ,(long)iVar11,(long)iVar12,lVar14,(long)iVar7,(uint)_Var15);
  }
  if (iVar12 < 1 || iVar11 < 1) {
    return (jas_image_t *)0x0;
  }
  if ((uVar17 != 0) &&
     (uVar13 = (local_e8 & 0x7fffffff) * (local_e0 & 0x7fffffff) * lVar14,
     uVar17 <= uVar13 && uVar13 - uVar17 != 0)) {
    jas_eprintf("maximum number of samples would be exceeded (%zu > %zu)\n",uVar13,uVar17);
    return (jas_image_t *)0x0;
  }
  lVar14 = 0;
  do {
    *(undefined8 *)((long)&local_d8[0].tlx + lVar14) = 0;
    *(undefined8 *)((long)&local_d8[0].tly + lVar14) = 0;
    *(undefined8 *)((long)&local_d8[0].hstep + lVar14) = 1;
    *(undefined8 *)((long)&local_d8[0].vstep + lVar14) = 1;
    *(ulong *)((long)&local_d8[0].width + lVar14) = local_e0 & 0x7fffffff;
    *(ulong *)((long)&local_d8[0].height + lVar14) = local_e8 & 0x7fffffff;
    iVar4 = pnm_maxvaltodepth((long)iVar7);
    *(int *)((long)&local_d8[0].prec + lVar14) = iVar4;
    *(uint *)((long)&local_d8[0].sgnd + lVar14) = (uint)_Var15;
    lVar14 = lVar14 + 0x38;
  } while (uVar6 * 0x38 != (int)lVar14);
  image = jas_image_create(uVar6,local_d8,0x4000);
  if (image == (jas_image_t *)0x0) {
    return (jas_image_t *)0x0;
  }
  ppjVar2 = image->cmpts_;
  (*ppjVar2)->type_ = 0;
  jVar9 = 0x301;
  if (bVar3) {
    ppjVar2[1]->type_ = 1;
    ppjVar2[2]->type_ = 2;
    jVar9 = 0x401;
  }
  image->clrspc_ = jVar9;
  iVar4 = pnm_getdata(in,&local_100,image,allow_trunc);
  if (iVar4 != 0) {
    jas_image_destroy(image);
    return (jas_image_t *)0x0;
  }
  return image;
}

Assistant:

jas_image_t *pnm_decode(jas_stream_t *in, const char *optstr)
{
	pnm_hdr_t hdr;
	jas_image_t *image;
	jas_image_cmptparm_t cmptparms[3];
	jas_image_cmptparm_t *cmptparm;
	int i;
	pnm_dec_importopts_t opts;
	size_t num_samples;

	image = 0;

	JAS_DBGLOG(10, ("pnm_decode(%p, \"%s\")\n", in, optstr ? optstr : ""));

	if (pnm_dec_parseopts(optstr, &opts)) {
		goto error;
	}

	/* Read the file header. */
	if (pnm_gethdr(in, &hdr)) {
		goto error;
	}
	JAS_DBGLOG(10, (
	  "magic %lx; width %lu; height %ld; numcmpts %d; maxval %ld; sgnd %d\n",
	  JAS_CAST(unsigned long, hdr.magic), JAS_CAST(long, hdr.width),
	  JAS_CAST(long, hdr.height), hdr.numcmpts, JAS_CAST(long, hdr.maxval),
	  hdr.sgnd)
	  );

	if (hdr.width <= 0 || hdr.height <= 0) {
		goto error;
	}

	if (!jas_safe_size_mul3(hdr.width, hdr.height, hdr.numcmpts,
	  &num_samples)) {
		jas_eprintf("image too large\n");
		goto error;
	}
	if (opts.max_samples > 0 && num_samples > opts.max_samples) {
		jas_eprintf(
		  "maximum number of samples would be exceeded (%zu > %zu)\n",
		  num_samples, opts.max_samples);
		goto error;
	}

	/* Create an image of the correct size. */
	for (i = 0, cmptparm = cmptparms; i < hdr.numcmpts; ++i, ++cmptparm) {
		cmptparm->tlx = 0;
		cmptparm->tly = 0;
		cmptparm->hstep = 1;
		cmptparm->vstep = 1;
		cmptparm->width = hdr.width;
		cmptparm->height = hdr.height;
		cmptparm->prec = pnm_maxvaltodepth(hdr.maxval);
		cmptparm->sgnd = hdr.sgnd;
	}
	if (!(image = jas_image_create(hdr.numcmpts, cmptparms,
	  JAS_CLRSPC_UNKNOWN))) {
		goto error;
	}

	if (hdr.numcmpts == 3) {
		jas_image_setclrspc(image, JAS_CLRSPC_SRGB);
		jas_image_setcmpttype(image, 0,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_R));
		jas_image_setcmpttype(image, 1,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_G));
		jas_image_setcmpttype(image, 2,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_B));
	} else {
		jas_image_setclrspc(image, JAS_CLRSPC_SGRAY);
		jas_image_setcmpttype(image, 0,
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_GRAY_Y));
	}

	/* Read image data from stream into image. */
	if (pnm_getdata(in, &hdr, image, opts.allow_trunc)) {
		goto error;
	}

	return image;

error:
	if (image) {
		jas_image_destroy(image);
	}
	return 0;
}